

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int luv_fs_rename(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  code *cb;
  luv_req_t *data;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar4 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar1 = luv_check_continuation(L,3);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  iVar1 = plVar5->callback_ref;
  loop = luv_loop(L);
  cb = luv_fs_cb;
  if (iVar1 == -2) {
    cb = (uv_fs_cb)0x0;
  }
  iVar2 = uv_fs_rename(loop,req,pcVar3,pcVar4,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 == -2) {
      iVar1 = push_fs_result(L,req);
      if (req->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req->data);
        req->data = (void *)0x0;
        uv_fs_req_cleanup(req);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
      iVar1 = 1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar3 = req->path;
    pcVar4 = uv_err_name((int)req->result);
    pcVar6 = uv_strerror((int)req->result);
    if (pcVar3 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar4,pcVar6);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar4,pcVar6,req->path);
    }
    pcVar3 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar3);
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int luv_fs_rename(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  const char* new_path = luaL_checkstring(L, 2);
  int ref = luv_check_continuation(L, 3);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(rename, req, path, new_path);
}